

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorDebug.cpp
# Opt level: O1

void debugPivotValueAnalysis
               (HighsInt highs_debug_level,HighsLogOptions *log_options,HighsInt num_row,
               vector<double,_std::allocator<double>_> *u_pivot_value)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_48;
  
  if (0 < highs_debug_level) {
    if (num_row < 1) {
      local_48 = INFINITY;
      dVar4 = 0.0;
      dVar3 = 0.0;
    }
    else {
      local_48 = INFINITY;
      dVar3 = 0.0;
      uVar1 = 0;
      dVar4 = 0.0;
      do {
        dVar2 = ABS((u_pivot_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar1]);
        if (dVar2 <= local_48) {
          local_48 = dVar2;
        }
        if (dVar4 <= dVar2) {
          dVar4 = dVar2;
        }
        dVar2 = log(dVar2);
        dVar3 = dVar3 + dVar2;
        uVar1 = uVar1 + 1;
      } while ((uint)num_row != uVar1);
    }
    dVar3 = exp(dVar3 / (double)num_row);
    if ((highs_debug_level != 1) || (local_48 < 1e-08)) {
      highsLogDev(log_options,kError,"InvertPivotAnalysis: %d pivots: Min %g; Mean %g; Max %g\n",
                  local_48,dVar3,dVar4,(ulong)(uint)num_row);
      return;
    }
  }
  return;
}

Assistant:

void debugPivotValueAnalysis(const HighsInt highs_debug_level,
                             const HighsLogOptions& log_options,
                             const HighsInt num_row,
                             const vector<double>& u_pivot_value) {
  if (highs_debug_level < kHighsDebugLevelCheap) return;
  double min_pivot = kHighsInf;
  double mean_pivot = 0;
  double max_pivot = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    double abs_pivot = fabs(u_pivot_value[iRow]);
    min_pivot = min(abs_pivot, min_pivot);
    max_pivot = max(abs_pivot, max_pivot);
    mean_pivot += log(abs_pivot);
  }
  mean_pivot = exp(mean_pivot / num_row);
  if (highs_debug_level > kHighsDebugLevelCheap || min_pivot < 1e-8)
    highsLogDev(log_options, HighsLogType::kError,
                "InvertPivotAnalysis: %" HIGHSINT_FORMAT
                " pivots: Min %g; Mean "
                "%g; Max %g\n",
                num_row, min_pivot, mean_pivot, max_pivot);
}